

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_cross_vec3(ShaderEvalContext *c)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float afStack_30 [2];
  undefined8 local_28;
  float local_20;
  int aiStack_18 [6];
  
  fVar1 = c->in[1].m_data[2];
  uVar2 = *(undefined8 *)c->in[0].m_data;
  uVar3 = *(undefined8 *)(c->in[0].m_data + 1);
  uVar4 = *(undefined8 *)c->in[1].m_data;
  fVar7 = (float)uVar4;
  fVar6 = (float)uVar2;
  fVar8 = (float)((ulong)uVar4 >> 0x20);
  local_28 = CONCAT44((float)((ulong)uVar2 >> 0x20) * fVar8 - fVar7 * (float)((ulong)uVar3 >> 0x20),
                      fVar6 * fVar7 - fVar1 * (float)uVar3);
  local_20 = fVar1 * c->in[0].m_data[2] - fVar8 * fVar6;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar5 = 2;
  do {
    (c->color).m_data[aiStack_18[lVar5]] = afStack_30[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }